

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O3

int leveldb::VarintLength(uint64_t v)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = 1;
  if (0x7f < v) {
    do {
      iVar2 = iVar2 + 1;
      bVar1 = 0x3fff < v;
      v = v >> 7;
    } while (bVar1);
  }
  return iVar2;
}

Assistant:

int VarintLength(uint64_t v) {
  int len = 1;
  while (v >= 128) {
    v >>= 7;
    len++;
  }
  return len;
}